

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaBlockMetadata_Linear::DebugLogAllAllocations(VmaBlockMetadata_Linear *this)

{
  const_iterator pVVar1;
  VmaBlockMetadata *this_00;
  const_iterator pVVar2;
  VmaBlockMetadata_Linear *in_RDI;
  const_iterator it_1;
  SuballocationVectorType *suballocations2nd;
  const_iterator it;
  SuballocationVectorType *suballocations1st;
  const_iterator userData;
  VkDeviceSize in_stack_ffffffffffffffd8;
  const_iterator offset;
  VmaBlockMetadata *in_stack_ffffffffffffffe0;
  const_iterator local_18;
  
  AccessSuballocations1st(in_RDI);
  local_18 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::begin
                       ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)0x2f01b7)
  ;
  local_18 = local_18 + in_RDI->m_1stNullItemsBeginCount;
  while( true ) {
    userData = local_18;
    pVVar1 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::end
                       ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)0x2f01e0)
    ;
    if (userData == pVVar1) break;
    if (local_18->type != VMA_SUBALLOCATION_TYPE_FREE) {
      VmaBlockMetadata::DebugLogAllocation
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(VkDeviceSize)in_RDI,userData);
    }
    local_18 = local_18 + 1;
  }
  this_00 = (VmaBlockMetadata *)AccessSuballocations2nd(in_RDI);
  pVVar1 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::begin
                     ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)0x2f0247);
  while( true ) {
    offset = pVVar1;
    pVVar2 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::end
                       ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)0x2f0260)
    ;
    if (pVVar1 == pVVar2) break;
    if (offset->type != VMA_SUBALLOCATION_TYPE_FREE) {
      VmaBlockMetadata::DebugLogAllocation
                (this_00,(VkDeviceSize)offset,(VkDeviceSize)in_RDI,userData);
    }
    pVVar1 = offset + 1;
  }
  return;
}

Assistant:

void VmaBlockMetadata_Linear::DebugLogAllAllocations() const
{
    const SuballocationVectorType& suballocations1st = AccessSuballocations1st();
    for (auto it = suballocations1st.begin() + m_1stNullItemsBeginCount; it != suballocations1st.end(); ++it)
        if (it->type != VMA_SUBALLOCATION_TYPE_FREE)
            DebugLogAllocation(it->offset, it->size, it->userData);

    const SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();
    for (auto it = suballocations2nd.begin(); it != suballocations2nd.end(); ++it)
        if (it->type != VMA_SUBALLOCATION_TYPE_FREE)
            DebugLogAllocation(it->offset, it->size, it->userData);
}